

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::PortalImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,PortalImageInfiniteLight *p,Transform *args,
          Image *args_1,RGBColorSpace **args_2,float *args_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *args_5,
          polymorphic_allocator<std::byte> *args_6)

{
  Image *in_RSI;
  undefined8 *in_R8;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *in_stack_000006b8;
  string *in_stack_000006c0;
  Float in_stack_000006cc;
  RGBColorSpace *in_stack_000006d0;
  Image *in_stack_000006d8;
  Transform *in_stack_000006e0;
  PortalImageInfiniteLight *in_stack_000006e8;
  Allocator in_stack_000006f0;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *this_00;
  Image *in_stack_fffffffffffffe88;
  Image *in_stack_fffffffffffffe90;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *in_stack_fffffffffffffea8;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *in_stack_fffffffffffffeb0;
  
  pbrt::Image::Image(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  this_00 = (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)*in_R8;
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight
            (in_stack_000006e8,in_stack_000006e0,in_stack_000006d8,in_stack_000006d0,
             in_stack_000006cc,in_stack_000006c0,in_stack_000006b8,in_stack_000006f0);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~vector(this_00);
  pbrt::Image::~Image(in_RSI);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }